

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall
presolve::HPresolve::okFromCSC
          (HPresolve *this,vector<double,_std::allocator<double>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  pointer piVar4;
  HighsLp *pHVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  bool bVar10;
  int iVar11;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  HighsInt pos;
  int iVar12;
  char *__from;
  ulong uVar13;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar14;
  value_type local_58;
  HighsLinearSumBounds *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  piVar4 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  bVar10 = okAssign<int>(&this->colhead,this->model->num_col_,-1);
  if ((!bVar10) || (bVar10 = okAssign<int>(&this->rowroot,this->model->num_row_,-1), !bVar10)) {
    return false;
  }
  bVar10 = okAssign<int>(&this->colsize,this->model->num_col_,0);
  if (!bVar10) {
    return false;
  }
  local_38 = &this->rowsize;
  bVar10 = okAssign<int>(local_38,this->model->num_row_,0);
  if (!bVar10) {
    return false;
  }
  bVar10 = okAssign<int>(&this->rowsizeInteger,this->model->num_row_,0);
  if (!bVar10) {
    return false;
  }
  bVar10 = okAssign<int>(&this->rowsizeImplInt,this->model->num_row_,0);
  if (!bVar10) {
    return false;
  }
  local_48 = (vector<int,std::allocator<int>> *)&this->Avalue;
  local_40 = &this->Acol;
  local_50 = &this->impliedRowBounds;
  HighsLinearSumBounds::setNumSums(local_50,0);
  HighsLinearSumBounds::setNumSums(&this->impliedDualRowBounds,0);
  pHVar5 = this->model;
  pdVar3 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->impliedRowBounds).varLower =
       (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->impliedRowBounds).varUpper = pdVar6;
  (this->impliedRowBounds).implVarLower = pdVar3;
  (this->impliedRowBounds).implVarUpper = pdVar7;
  (this->impliedRowBounds).implVarLowerSource = piVar4;
  (this->impliedRowBounds).implVarUpperSource = piVar8;
  HighsLinearSumBounds::setNumSums(local_50,pHVar5->num_row_);
  pHVar5 = this->model;
  pdVar3 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->impliedDualRowBounds).varLower =
       (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->impliedDualRowBounds).varUpper = pdVar3;
  (this->impliedDualRowBounds).implVarLower = pdVar6;
  (this->impliedDualRowBounds).implVarUpper = pdVar7;
  (this->impliedDualRowBounds).implVarLowerSource = piVar4;
  (this->impliedDualRowBounds).implVarUpperSource = piVar8;
  HighsLinearSumBounds::setNumSums(&this->impliedDualRowBounds,pHVar5->num_col_);
  local_50 = (HighsLinearSumBounds *)
             ((long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  pdVar3 = (Aval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar6 = (Aval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_48,Aval);
  iVar11 = (int)((ulong)((long)pdVar3 - (long)pdVar6) >> 3);
  bVar10 = okReserve<int>(local_40,iVar11);
  if (!bVar10) {
    return false;
  }
  local_48 = (vector<int,std::allocator<int>> *)&this->Arow;
  bVar10 = okReserve<int>((vector<int,_std::allocator<int>_> *)local_48,iVar11);
  iVar12 = 0;
  if (!bVar10) {
    return false;
  }
  uVar13 = (ulong)local_50 >> 2;
  while( true ) {
    local_58._M_node._0_4_ = iVar12;
    if (iVar12 == (int)uVar13 + -1) break;
    piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    std::vector<int,_std::allocator<int>_>::insert
              (local_40,(const_iterator)
                        (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
               (long)piVar4[(long)iVar12 + 1] - (long)piVar4[iVar12],
               (value_type_conflict2 *)&local_58);
    piVar4 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar8 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
              (local_48,(const_iterator)
                        (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (piVar4 + piVar8[(int)local_58._M_node]),
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (piVar4 + piVar8[(long)(int)local_58._M_node + 1]));
    iVar12 = (int)local_58._M_node + 1;
  }
  bVar10 = okResize<int>(&this->Anext,iVar11,0);
  if (!bVar10) {
    return false;
  }
  bVar10 = okResize<int>(&this->Aprev,iVar11,0);
  if (!bVar10) {
    return false;
  }
  bVar10 = okResize<int>(&this->ARleft,iVar11,0);
  if (!bVar10) {
    return false;
  }
  __from = (char *)0x0;
  bVar10 = okResize<int>(&this->ARright,iVar11,0);
  __to = extraout_RDX;
  if (!bVar10) {
    return false;
  }
  for (; iVar11 != (int)__from; __from = (char *)(ulong)((int)__from + 1)) {
    link(this,__from,__to);
    __to = extraout_RDX_00;
  }
  if ((this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return true;
  }
  local_58._M_node = &(this->equations)._M_t._M_impl.super__Rb_tree_header._M_header;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ::_M_fill_assign(&this->eqiters,(long)this->model->num_row_,&local_58);
  pvVar9 = local_38;
  iVar11 = 0;
  while( true ) {
    local_58._M_node._0_4_ = iVar11;
    pHVar5 = this->model;
    if (iVar11 == pHVar5->num_row_) break;
    dVar2 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar11];
    pdVar1 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + iVar11;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
      pVar14 = std::
               _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::_M_emplace_unique<int&,int&>
                         ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                           *)&this->equations,
                          (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar11,(int *)&local_58);
      (this->eqiters).
      super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(int)local_58._M_node]._M_node =
           pVar14.first._M_node._M_node;
      iVar11 = (int)local_58._M_node;
    }
    iVar11 = iVar11 + 1;
  }
  return true;
}

Assistant:

bool HPresolve::okFromCSC(const std::vector<double>& Aval,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<HighsInt>& Astart) {
  Avalue.clear();
  Acol.clear();
  Arow.clear();

  freeslots.clear();
  if (!okAssign(colhead, model->num_col_, HighsInt{-1})) return false;
  if (!okAssign(rowroot, model->num_row_, HighsInt{-1})) return false;
  if (!okAssign(colsize, model->num_col_)) return false;
  if (!okAssign(rowsize, model->num_row_)) return false;
  if (!okAssign(rowsizeInteger, model->num_row_)) return false;
  if (!okAssign(rowsizeImplInt, model->num_row_)) return false;

  impliedRowBounds.setNumSums(0);
  impliedDualRowBounds.setNumSums(0);
  impliedRowBounds.setBoundArrays(
      model->col_lower_.data(), model->col_upper_.data(), implColLower.data(),
      implColUpper.data(), colLowerSource.data(), colUpperSource.data());
  impliedRowBounds.setNumSums(model->num_row_);
  impliedDualRowBounds.setBoundArrays(
      rowDualLower.data(), rowDualUpper.data(), implRowDualLower.data(),
      implRowDualUpper.data(), rowDualLowerSource.data(),
      rowDualUpperSource.data());
  impliedDualRowBounds.setNumSums(model->num_col_);

  HighsInt ncol = Astart.size() - 1;
  assert(ncol == int(colhead.size()));
  HighsInt nnz = Aval.size();

  Avalue = Aval;
  if (!okReserve(Acol, nnz)) return false;
  if (!okReserve(Arow, nnz)) return false;

  for (HighsInt i = 0; i != ncol; ++i) {
    HighsInt collen = Astart[i + 1] - Astart[i];
    Acol.insert(Acol.end(), collen, i);
    Arow.insert(Arow.end(), Aindex.begin() + Astart[i],
                Aindex.begin() + Astart[i + 1]);
  }

  if (!okResize(Anext, nnz)) return false;
  if (!okResize(Aprev, nnz)) return false;
  if (!okResize(ARleft, nnz)) return false;
  if (!okResize(ARright, nnz)) return false;
  for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);

  if (equations.empty()) {
    try {
      eqiters.assign(model->num_row_, equations.end());
    } catch (const std::bad_alloc& e) {
      printf("HPresolve::okFromCSC eqiters.assign fails with %s\n", e.what());
      return false;
    }
    for (HighsInt i = 0; i != model->num_row_; ++i) {
      // register equation
      if (model->row_lower_[i] == model->row_upper_[i])
        eqiters[i] = equations.emplace(rowsize[i], i).first;
    }
  }
  return true;
}